

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O0

void __thiscall MakefileGenerator::verifyCompilers(MakefileGenerator *this)

{
  bool bVar1;
  ProString *b;
  QList<ProString> *this_00;
  ProString *this_01;
  qsizetype qVar2;
  const_reference key;
  QStringBuilder<QStringBuilder<const_char_(&)[22],_ProString_&>,_const_char_(&)[2]> *str;
  char *pcVar3;
  long in_FS_OFFSET;
  ProString *comp;
  bool error;
  int i;
  ProStringList *quc;
  ProValueMap *v;
  ProKey ofkey;
  ProKey okey;
  ProString *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  byte in_stack_fffffffffffffe37;
  ProString *this_02;
  ProKey *in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int iVar4;
  undefined1 local_a8 [48];
  QStringBuilder<const_ProString_&,_const_char_(&)[8]> local_78;
  undefined1 local_68 [96];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  b = (ProString *)QMakeProject::variables((QMakeProject *)0x173ff1);
  this_02 = b;
  ProKey::ProKey((ProKey *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 (char *)in_stack_fffffffffffffe28);
  this_00 = &QMap<ProKey,_ProStringList>::operator[]
                       ((QMap<ProKey,_ProStringList> *)
                        CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                        in_stack_fffffffffffffe58)->super_QList<ProString>;
  ProKey::~ProKey((ProKey *)0x174047);
  iVar4 = 0;
  while( true ) {
    this_01 = (ProString *)(long)iVar4;
    qVar2 = QList<ProString>::size(this_00);
    if (qVar2 <= (long)this_01) break;
    in_stack_fffffffffffffe60 = in_stack_fffffffffffffe60 & 0xffffff;
    key = QList<ProString>::at
                    ((QList<ProString> *)
                     CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                     (qsizetype)in_stack_fffffffffffffe28);
    memset(local_68,0xaa,0x30);
    local_78 = ::operator+((ProString *)
                           CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                           (char (*) [8])in_stack_fffffffffffffe28);
    ProKey::ProKey<ProString_const&,char_const(&)[8]>
              ((ProKey *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               (QStringBuilder<const_ProString_&,_const_char_(&)[8]> *)in_stack_fffffffffffffe28);
    QMap<ProKey,_ProStringList>::operator[]
              ((QMap<ProKey,_ProStringList> *)CONCAT44(iVar4,in_stack_fffffffffffffe60),
               (ProKey *)key);
    bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x17410d);
    if (bVar1) {
      memset(local_a8,0xaa,0x30);
      ::operator+((ProString *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                  (char (*) [17])in_stack_fffffffffffffe28);
      ProKey::ProKey<ProString_const&,char_const(&)[17]>
                ((ProKey *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 (QStringBuilder<const_ProString_&,_const_char_(&)[17]> *)in_stack_fffffffffffffe28)
      ;
      QMap<ProKey,_ProStringList>::operator[]
                ((QMap<ProKey,_ProStringList> *)CONCAT44(iVar4,in_stack_fffffffffffffe60),
                 (ProKey *)key);
      bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x17417d);
      if (bVar1) {
        in_stack_fffffffffffffe60 = CONCAT13(1,(int3)in_stack_fffffffffffffe60);
        ProString::toLatin1(this_02);
        pcVar3 = QByteArray::constData((QByteArray *)0x17424b);
        warn_msg(WarnLogic,"Compiler: %s: No output file specified",pcVar3);
        QByteArray::~QByteArray((QByteArray *)0x17426e);
      }
      else {
        str = (QStringBuilder<QStringBuilder<const_char_(&)[22],_ProString_&>,_const_char_(&)[2]> *)
              QMap<ProKey,_ProStringList>::operator[]
                        ((QMap<ProKey,_ProStringList> *)CONCAT44(iVar4,in_stack_fffffffffffffe60),
                         (ProKey *)key);
        QMap<ProKey,_ProStringList>::operator[]
                  ((QMap<ProKey,_ProStringList> *)CONCAT44(iVar4,in_stack_fffffffffffffe60),
                   (ProKey *)key);
        QList<ProString>::first
                  ((QList<ProString> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30)
                  );
        ::operator+((char (*) [22])CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                    in_stack_fffffffffffffe28);
        ::operator+((QStringBuilder<const_char_(&)[22],_ProString_&> *)
                    CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                    (char (*) [2])in_stack_fffffffffffffe28);
        ProString::ProString<QStringBuilder<char_const(&)[22],ProString&>,char_const(&)[2]>
                  (this_01,str);
        QList<ProString>::append
                  ((QList<ProString> *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30)
                   ,in_stack_fffffffffffffe28);
        ProString::~ProString((ProString *)0x174225);
      }
      ProKey::~ProKey((ProKey *)0x17427b);
    }
    else {
      in_stack_fffffffffffffe28 = b;
      ::operator+((ProString *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                  (char (*) [7])b);
      ProKey::ProKey<ProString_const&,char_const(&)[7]>
                ((ProKey *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 (QStringBuilder<const_ProString_&,_const_char_(&)[7]> *)in_stack_fffffffffffffe28);
      QMap<ProKey,_ProStringList>::operator[]
                ((QMap<ProKey,_ProStringList> *)CONCAT44(iVar4,in_stack_fffffffffffffe60),
                 (ProKey *)key);
      in_stack_fffffffffffffe37 = QList<ProString>::isEmpty((QList<ProString> *)0x1742cf);
      ProKey::~ProKey((ProKey *)0x1742e0);
      if ((in_stack_fffffffffffffe37 & 1) != 0) {
        in_stack_fffffffffffffe60 = CONCAT13(1,(int3)in_stack_fffffffffffffe60);
        ProString::toLatin1(this_02);
        pcVar3 = QByteArray::constData((QByteArray *)0x174308);
        warn_msg(WarnLogic,"Compiler: %s: No input variable specified",pcVar3);
        QByteArray::~QByteArray((QByteArray *)0x174328);
      }
    }
    if ((in_stack_fffffffffffffe60 & 0x1000000) == 0) {
      iVar4 = iVar4 + 1;
    }
    else {
      ProStringList::removeAt
                ((ProStringList *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                 (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    }
    ProKey::~ProKey((ProKey *)0x174359);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void
MakefileGenerator::verifyCompilers()
{
    ProValueMap &v = project->variables();
    ProStringList &quc = v["QMAKE_EXTRA_COMPILERS"];
    for(int i = 0; i < quc.size(); ) {
        bool error = false;
        const ProString &comp = quc.at(i);
        const ProKey okey(comp + ".output");
        if (v[okey].isEmpty()) {
            const ProKey ofkey(comp + ".output_function");
            if (!v[ofkey].isEmpty()) {
                v[okey].append("${QMAKE_FUNC_FILE_IN_" + v[ofkey].first() + "}");
            } else {
                error = true;
                warn_msg(WarnLogic, "Compiler: %s: No output file specified", comp.toLatin1().constData());
            }
        } else if (v[ProKey(comp + ".input")].isEmpty()) {
            error = true;
            warn_msg(WarnLogic, "Compiler: %s: No input variable specified", comp.toLatin1().constData());
        }
        if(error)
            quc.removeAt(i);
        else
            ++i;
    }
}